

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O0

void __thiscall
duckdb::DuckTableEntry::UndoAlter(DuckTableEntry *this,ClientContext *context,AlterInfo *info)

{
  DataTable *this_00;
  long in_RDI;
  AlterTableInfo *table_info;
  ParseInfo *in_stack_ffffffffffffffa0;
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  
  this_00 = (DataTable *)ParseInfo::Cast<duckdb::AlterTableInfo>(in_stack_ffffffffffffffa0);
  if (*(char *)((long)&(this_00->row_groups).internal.
                       super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 1) == '\x02') {
    shared_ptr<duckdb::DataTable,_true>::operator->
              ((shared_ptr<duckdb::DataTable,_true> *)in_stack_ffffffffffffffa0);
    ::std::__cxx11::string::string(local_40,(string *)(in_RDI + 0x20));
    DataTable::SetTableName(this_00,in_stack_ffffffffffffffd8);
    ::std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void DuckTableEntry::UndoAlter(ClientContext &context, AlterInfo &info) {
	D_ASSERT(!internal);
	D_ASSERT(info.type == AlterType::ALTER_TABLE);
	auto &table_info = info.Cast<AlterTableInfo>();
	switch (table_info.alter_table_type) {
	case AlterTableType::RENAME_TABLE: {
		storage->SetTableName(this->name);
		break;
	default:
		break;
	}
	}
}